

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void save_node_stats(log_multi *d)

{
  uint uVar1;
  FILE *__stream;
  long lVar2;
  node *pnVar3;
  node_pred *pnVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  __stream = fopen64("atxm_debug.csv","wt");
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    pnVar3 = (d->nodes)._begin;
    if ((ulong)(((long)(d->nodes)._end - (long)pnVar3) / 0x58) <= uVar8) break;
    fprintf(__stream,"Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n",
            pnVar3[uVar8].Eh / (double)pnVar3[uVar8].n,uVar8,(ulong)pnVar3[uVar8].internal);
    fwrite("Label:, ",8,1,__stream);
    uVar1 = 0;
    while( true ) {
      pnVar3 = (d->nodes)._begin;
      pnVar4 = pnVar3[uVar8].preds._begin;
      if ((ulong)(((long)pnVar3[uVar8].preds._end - (long)pnVar4) / 0x18) <= (ulong)uVar1) break;
      fprintf(__stream,"%6d,",(ulong)pnVar4[uVar1].label);
      uVar1 = uVar1 + 1;
    }
    fputc(10,__stream);
    fwrite("Ehk:, ",6,1,__stream);
    uVar1 = 0;
    while( true ) {
      uVar6 = (ulong)uVar1;
      pnVar3 = (d->nodes)._begin;
      pnVar4 = pnVar3[uVar8].preds._begin;
      lVar2 = (long)pnVar3[uVar8].preds._end - (long)pnVar4;
      if ((ulong)(lVar2 / 0x18) <= uVar6) break;
      fprintf(__stream,"%7.4f,",pnVar4[uVar6].Ehk / (double)pnVar4[uVar6].nk,lVar2 % 0x18);
      uVar1 = uVar1 + 1;
    }
    fputc(10,__stream);
    fwrite("nk:, ",5,1,__stream);
    pnVar3 = (d->nodes)._begin;
    pnVar4 = pnVar3[uVar8].preds._begin;
    uVar5 = 0;
    for (uVar1 = 0; uVar6 = (ulong)uVar1,
        uVar6 < (ulong)(((long)pnVar3[uVar8].preds._end - (long)pnVar4) / 0x18); uVar1 = uVar1 + 1)
    {
      fprintf(__stream,"%6d,",(ulong)pnVar4[uVar6].nk);
      pnVar3 = (d->nodes)._begin;
      pnVar4 = pnVar3[uVar8].preds._begin;
      uVar5 = uVar5 + pnVar4[uVar6].nk;
    }
    fputc(10,__stream);
    pnVar3 = (d->nodes)._begin;
    fprintf(__stream,"max(lab:cnt:tot):, %3d,%6d,%7d,\n",(ulong)pnVar3[uVar8].max_count_label,
            (ulong)pnVar3[uVar8].max_count,(ulong)uVar5);
    pnVar3 = (d->nodes)._begin;
    fprintf(__stream,"left: %4d, right: %4d",(ulong)pnVar3[uVar8].left,(ulong)pnVar3[uVar8].right);
    fwrite("\n\n",2,1,__stream);
    uVar7 = uVar7 + 1;
  }
  fclose(__stream);
  return;
}

Assistant:

void save_node_stats(log_multi& d)
{
  FILE* fp;
  uint32_t i, j;
  uint32_t total;
  log_multi* b = &d;

  fp = fopen("atxm_debug.csv", "wt");

  for (i = 0; i < b->nodes.size(); i++)
  {
    fprintf(fp, "Node: %4d, Internal: %1d, Eh: %7.4f, n: %6d, \n", (int)i, (int)b->nodes[i].internal,
        b->nodes[i].Eh / b->nodes[i].n, b->nodes[i].n);

    fprintf(fp, "Label:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].label);
    }
    fprintf(fp, "\n");

    fprintf(fp, "Ehk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%7.4f,", b->nodes[i].preds[j].Ehk / b->nodes[i].preds[j].nk);
    }
    fprintf(fp, "\n");

    total = 0;

    fprintf(fp, "nk:, ");
    for (j = 0; j < b->nodes[i].preds.size(); j++)
    {
      fprintf(fp, "%6d,", (int)b->nodes[i].preds[j].nk);
      total += b->nodes[i].preds[j].nk;
    }
    fprintf(fp, "\n");

    fprintf(fp, "max(lab:cnt:tot):, %3d,%6d,%7d,\n", (int)b->nodes[i].max_count_label, (int)b->nodes[i].max_count,
        (int)total);
    fprintf(fp, "left: %4d, right: %4d", (int)b->nodes[i].left, (int)b->nodes[i].right);
    fprintf(fp, "\n\n");
  }

  fclose(fp);
}